

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 jx9VmPushFilePath(jx9_vm *pVm,char *zPath,int nLen,sxu8 bMain,sxi32 *pNew)

{
  void *pvVar1;
  int iVar2;
  sxi32 sVar3;
  uint uVar4;
  char *pChunk;
  long lVar5;
  SyString sPath;
  
  if (nLen < 0) {
    nLen = SyStrlen(zPath);
  }
  pChunk = SyMemBackendStrDup(&pVm->sAllocator,zPath,nLen);
  if (pChunk != (char *)0x0) {
    sPath.zString = pChunk;
    sPath.nByte = nLen;
    if (bMain == '\0') {
      pvVar1 = (pVm->aIncluded).pBase;
      uVar4 = (pVm->aIncluded).nUsed;
      lVar5 = 0;
      do {
        if ((ulong)uVar4 * 0x10 + 0x10 == lVar5 + 0x10) {
          sVar3 = SySetPut(&pVm->aIncluded,&sPath);
          if (sVar3 != 0) {
            sVar3 = SyMemBackendFree(&pVm->sAllocator,pChunk);
            return sVar3;
          }
          sVar3 = 1;
          goto LAB_00120ae6;
        }
        iVar2 = nLen - *(int *)((long)pvVar1 + lVar5 + 8);
        if (iVar2 == 0) {
          iVar2 = SyMemcmp(pChunk,*(void **)((long)pvVar1 + lVar5),nLen);
        }
        lVar5 = lVar5 + 0x10;
      } while (iVar2 != 0);
      sVar3 = 0;
LAB_00120ae6:
      *pNew = sVar3;
    }
    uVar4 = SySetPut(&pVm->aFiles,&sPath);
    pChunk = (char *)(ulong)uVar4;
  }
  return (sxi32)pChunk;
}

Assistant:

JX9_PRIVATE sxi32 jx9VmPushFilePath(jx9_vm *pVm, const char *zPath, int nLen, sxu8 bMain, sxi32 *pNew)
{
	SyString sPath;
	char *zDup;
#ifdef __WINNT__
	char *zCur;
#endif
	sxi32 rc;
	if( nLen < 0 ){
		nLen = SyStrlen(zPath);
	}
	/* Duplicate the file path first */
	zDup = SyMemBackendStrDup(&pVm->sAllocator, zPath, nLen);
	if( zDup == 0 ){
		return SXERR_MEM;
	}
#ifdef __WINNT__
	/* Normalize path on windows
	 * Example:
	 *    Path/To/File.jx9
	 * becomes
	 *   path\to\file.jx9
	 */
	zCur = zDup;
	while( zCur[0] != 0 ){
		if( zCur[0] == '/' ){
			zCur[0] = '\\';
		}else if( (unsigned char)zCur[0] < 0xc0 && SyisUpper(zCur[0]) ){
			int c = SyToLower(zCur[0]);
			zCur[0] = (char)c; /* MSVC stupidity */
		}
		zCur++;
	}
#endif
	/* Install the file path */
	SyStringInitFromBuf(&sPath, zDup, nLen);
	if( !bMain ){
		if( VmIsIncludedFile(&(*pVm), &sPath) ){
			/* Already included */
			*pNew = 0;
		}else{
			/* Insert in the corresponding container */
			rc = SySetPut(&pVm->aIncluded, (const void *)&sPath);
			if( rc != SXRET_OK ){
				SyMemBackendFree(&pVm->sAllocator, zDup);
				return rc;
			}
			*pNew = 1;
		}
	}
	SySetPut(&pVm->aFiles, (const void *)&sPath);
	return SXRET_OK;
}